

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O2

double __thiscall packing::AssignedProtos::relSizeOf(AssignedProtos *this,ProtoPalette *protoPal)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  difference_type dVar3;
  const_iterator __first;
  Iter<__gnu_cxx::__normal_iterator<const_std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::add_const_t>
  __last;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_src_gfx_pal_packing_cpp:212:43)>
  __pred;
  uint16_t color;
  value_type_conflict2 local_2a;
  double local_28;
  
  pvVar1 = ProtoPalette::begin(protoPal);
  pvVar2 = ProtoPalette::end(protoPal);
  local_28 = 0.0;
  for (; pvVar1 != pvVar2; pvVar1 = pvVar1 + 1) {
    local_2a = *pvVar1;
    __first = begin(this);
    __last._iter._M_current =
         (this->_assigned).
         super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    __last._array = &this->_assigned;
    __pred._M_pred.color = &local_2a;
    __pred._M_pred.this = this;
    dVar3 = std::
            __count_if<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>const*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::add_const_t>,__gnu_cxx::__ops::_Iter_pred<packing::AssignedProtos::relSizeOf(ProtoPalette_const&)const::_lambda(packing::ProtoPalAttrs_const&)_1_>>
                      (__first,__last,__pred);
    local_28 = local_28 + 1.0 / (double)(dVar3 + 1);
  }
  return local_28;
}

Assistant:

double relSizeOf(ProtoPalette const &protoPal) const {
		// NOTE: this function must not call `uniqueColors`, or one of its callers will break!
		double relSize = 0.;
		for (uint16_t color : protoPal) {
			auto n = std::count_if(begin(), end(), [this, &color](ProtoPalAttrs const &attrs) {
				ProtoPalette const &pal = (*_protoPals)[attrs.protoPalIndex];
				return std::find(pal.begin(), pal.end(), color) != pal.end();
			});
			// NOTE: The paper and the associated code disagree on this: the code has
			// this `1 +`, whereas the paper does not; its lack causes a division by 0
			// if the symbol is not found anywhere, so I'm assuming the paper is wrong.
			relSize += 1. / (1 + n);
		}
		return relSize;
	}